

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filefind.cpp
# Opt level: O1

void __thiscall Am_Data_Locator::Add_Search_Directory(Am_Data_Locator *this,Am_Filename *dir)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _List_node_base *p_Var3;
  pointer pcVar4;
  int iVar5;
  _List_iterator<std::pair<Am_Filename,_unsigned_int>_> _Var6;
  _List_node_base *p_Var7;
  stat buf;
  search_pred local_d8;
  undefined1 local_b8 [17];
  undefined7 uStack_a7;
  uint uStack_a0;
  __uid_t _Stack_9c;
  __gid_t local_98;
  
  iVar5 = stat((dir->filename)._M_dataplus._M_p,(stat *)local_b8);
  if ((iVar5 == 0) && ((uStack_a0 & 0xf000) == 0x4000)) {
    _Var6._M_node =
         (this->search_list).
         super__List_base<std::pair<Am_Filename,_unsigned_int>,_std::allocator<std::pair<Am_Filename,_unsigned_int>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    paVar2 = &local_d8.dirname.filename.field_2;
    pcVar4 = (dir->filename)._M_dataplus._M_p;
    local_d8.dirname.filename._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar4,pcVar4 + (dir->filename)._M_string_length);
    _Var6 = std::find_if<std::_List_iterator<std::pair<Am_Filename,unsigned_int>>,search_pred>
                      (_Var6,(_List_iterator<std::pair<Am_Filename,_unsigned_int>_>)this,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.dirname.filename._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8.dirname.filename._M_dataplus._M_p);
    }
    if (_Var6._M_node == (_List_node_base *)this) {
      p_Var3 = (_List_node_base *)(local_b8 + 0x10);
      pcVar4 = (dir->filename)._M_dataplus._M_p;
      local_b8._0_8_ = p_Var3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b8,pcVar4,pcVar4 + (dir->filename)._M_string_length);
      local_98 = 1;
      p_Var7 = (_List_node_base *)operator_new(0x38);
      p_Var7[1]._M_next = p_Var7 + 2;
      if ((_List_node_base *)local_b8._0_8_ == p_Var3) {
        p_Var7[2]._M_next = (_List_node_base *)CONCAT71(uStack_a7,local_b8[0x10]);
        p_Var7[2]._M_prev = (_List_node_base *)CONCAT44(_Stack_9c,uStack_a0);
      }
      else {
        p_Var7[1]._M_next = (_List_node_base *)local_b8._0_8_;
        p_Var7[2]._M_next = (_List_node_base *)CONCAT71(uStack_a7,local_b8[0x10]);
      }
      p_Var7[1]._M_prev = (_List_node_base *)local_b8._8_8_;
      local_b8._8_8_ = 0;
      local_b8[0x10] = 0;
      *(__gid_t *)&p_Var7[3]._M_next = local_98;
      local_b8._0_8_ = p_Var3;
      std::__detail::_List_node_base::_M_hook(p_Var7);
      psVar1 = &(this->search_list).
                super__List_base<std::pair<Am_Filename,_unsigned_int>,_std::allocator<std::pair<Am_Filename,_unsigned_int>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if ((_List_node_base *)local_b8._0_8_ != p_Var3) {
        operator_delete((void *)local_b8._0_8_);
      }
    }
    else {
      *(int *)&_Var6._M_node[3]._M_next = *(int *)&_Var6._M_node[3]._M_next + 1;
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Am_Data_Locator: search path ",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(dir->filename)._M_dataplus._M_p,(dir->filename)._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," is not a directory!",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  return;
}

Assistant:

void
Am_Data_Locator::Add_Search_Directory(const Am_Filename &dir)
{
  if (dir.Is_Directory()) {
    dir_list_t::iterator it =
        std::find_if(search_list.begin(), search_list.end(), search_pred(dir));
    if (it == search_list.end())
      // Put the directory in first place on search list (with a count of 1)
      search_list.push_front(std::pair<Am_Filename, unsigned int>(dir, 1));
    else
      // Increments the reference count of that directory
      ++((*it).second);
  } else
    std::cout << "Am_Data_Locator: search path " << dir
              << " is not a directory!" << std::endl;
  return;
}